

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O1

void __thiscall
duckdb::Binder::ExpandStarExpression
          (Binder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *new_select_list)

{
  ClientContext *context;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pVVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  pointer pcVar5;
  _Head_base<0UL,_duckdb_re2::RE2_*,_false> _Var6;
  pointer puVar7;
  pointer puVar8;
  StarExpressionType SVar9;
  int iVar10;
  pointer pPVar11;
  pointer pEVar12;
  type expr_00;
  string *psVar13;
  RE2 *this_00;
  pointer pRVar14;
  type pPVar15;
  ColumnRefExpression *pCVar16;
  type re;
  LogicalType *pLVar17;
  vector<duckdb::Value,_true> *pvVar18;
  duckdb *this_01;
  iterator iVar19;
  BaseExpression *this_02;
  StarExpression *pSVar20;
  reference pvVar21;
  pointer pPVar22;
  ParameterNotResolvedException *this_03;
  BinderException *pBVar23;
  pointer pVVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  ParsedExpression *expr_01;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> _Var26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *expanded_expr;
  size_type __n;
  bool bVar27;
  StarExpression *star;
  unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true> regex;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> result;
  string str;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> child;
  string err;
  optional_ptr<duckdb::ParsedExpression,_true> child_expr;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  copied_star_p;
  TableFunctionBinder binder;
  StarExpression *local_2f8;
  _Head_base<0UL,_duckdb_re2::RE2_*,_false> local_2f0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_2e8;
  undefined1 local_2d0 [8];
  string local_2c8;
  undefined1 local_2a8;
  Binder *local_298;
  Binder *local_290;
  undefined1 local_288 [16];
  undefined1 local_278 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_258;
  string *local_248;
  Binder *local_240;
  undefined1 local_238 [24];
  Value local_220;
  Binder *local_1e0;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  string local_1b8;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *local_138 [2];
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> local_128 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  string local_d8;
  TableFunctionBinder local_b8;
  
  TryTransformStarLike(expr);
  local_2f8 = (StarExpression *)0x0;
  SVar9 = FindStarExpression(this,expr,&local_2f8,true,false);
  if (SVar9 == NONE) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)new_select_list,expr);
  }
  else {
    local_2e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298 = (Binder *)expr;
    local_240 = (Binder *)new_select_list;
    BindContext::GenerateAllColumnExpressions
              (&this->bind_context,local_2f8,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_2e8);
    local_2f0._M_head_impl = (RE2 *)0x0;
    if ((local_2f8->expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      TableFunctionBinder::TableFunctionBinder(&local_b8,this,this->context,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(&local_2f8->expr);
      (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_290,pPVar11);
      params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_2d0,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_b8,(LogicalType *)&local_290,false);
      pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_2d0);
      iVar10 = (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar12);
      if ((char)iVar10 == '\0') {
        pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(&local_2f8->expr);
        iVar10 = (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[6])(pPVar11);
        this_03 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        if ((char)iVar10 == '\0') {
          local_220.type_._0_8_ =
               &local_220.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_238 + 0x18),"Unsupported expression in COLUMNS","");
          BinderException::BinderException((BinderException *)this_03,(string *)(local_238 + 0x18));
          __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ParameterNotResolvedException::ParameterNotResolvedException(this_03);
        __cxa_throw(this_03,&ParameterNotResolvedException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
      context = this->context;
      local_1e0 = this;
      expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)local_2d0);
      pVVar24 = (pointer)0x0;
      ExpressionExecutor::EvaluateScalar((Value *)(local_238 + 0x18),context,expr_00,false);
      if (local_220.type_.id_ == 'e') {
        pLVar17 = ListType::GetChildType((LogicalType *)(local_238 + 0x18));
        if (pLVar17->id_ != VARCHAR) goto LAB_00da00cf;
        if (local_220.is_null != false) {
LAB_00da013b:
          local_1d8[0] = local_1c8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d8,
                     "Star expression \"%s\" resulted in an empty set of columns","");
          (*(local_2f8->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[8])
                    (&local_f8);
          StringUtil::Format<std::__cxx11::string>
                    ((string *)local_288,(StringUtil *)local_1d8,&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVVar24);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          if (local_1d8[0] != local_1c8) {
            operator_delete(local_1d8[0]);
          }
          pBVar23 = (BinderException *)__cxa_allocate_exception(0x10);
          BinderException::BinderException<>
                    (pBVar23,&local_2f8->super_ParsedExpression,(string *)local_288);
          __cxa_throw(pBVar23,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar18 = ListValue::GetChildren((Value *)(local_238 + 0x18));
        pVVar24 = (pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pVVar24 ==
            (pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00da013b;
        pvVar18 = ListValue::GetChildren((Value *)(local_238 + 0x18));
        local_238._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_238._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_238._16_8_ = (pointer)0x0;
        local_288._0_8_ = &aStack_258;
        local_288._8_8_ = &DAT_00000001;
        local_278._0_8_ = (ParsedExpression *)0x0;
        local_278._8_8_ = (pointer)0x0;
        local_278._16_4_ = 1.0;
        local_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        aStack_258._M_allocated_capacity = 0;
        pVVar24 = (pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pVVar3 = (pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pVVar24 != pVVar3) {
          paVar25 = &local_2c8.field_2;
          do {
            if (pVVar24->is_null == true) {
              pBVar23 = (BinderException *)__cxa_allocate_exception(0x10);
              pSVar20 = local_2f8;
              local_2c8._M_dataplus._M_p = (pointer)paVar25;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2c8,
                         "Columns expression does not support NULL input parameters","");
              BinderException::BinderException<>
                        (pBVar23,&pSVar20->super_ParsedExpression,&local_2c8);
              __cxa_throw(pBVar23,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            psVar13 = StringValue::Get_abi_cxx11_(pVVar24);
            pcVar5 = (psVar13->_M_dataplus)._M_p;
            local_2c8._M_dataplus._M_p = (pointer)paVar25;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2c8,pcVar5,pcVar5 + psVar13->_M_string_length);
            local_2a8 = 0;
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string,bool>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_288,&local_2c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != paVar25) {
              operator_delete(local_2c8._M_dataplus._M_p);
            }
            pVVar24 = pVVar24 + 1;
          } while (pVVar24 != pVVar3);
        }
        puVar7 = local_2e8.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var26._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
             (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
             local_278._0_8_;
        if (local_2e8.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_2e8.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e8.
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          do {
            this_01 = (duckdb *)
                      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)&paVar25->_M_allocated_capacity);
            GetColumnsStringValue_abi_cxx11_(&local_2c8,this_01,expr_01);
            iVar19 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_288,&local_2c8);
            if (iVar19.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                ._M_cur != (__node_type *)0x0) {
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                          *)local_238,
                         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)&paVar25->_M_allocated_capacity);
              *(undefined1 *)
               ((long)iVar19.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                      ._M_cur + 0x28) = 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p);
            }
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar25 + 8);
            _Var26._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
                 (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
                 local_278._0_8_;
          } while (paVar25 !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)puVar7);
        }
        for (; local_2c8.field_2._M_allocated_capacity =
                    (size_type)
                    local_2e8.
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
            local_2c8._M_string_length =
                 (size_type)
                 local_2e8.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
            puVar7 = local_2e8.
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             )_Var26._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             )0x0; _Var26._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                        (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                         )(_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                           )*(_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                              *)_Var26._M_t.
                                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                _M_head_impl) {
          if (*(char *)&(((pointer)
                         ((long)_Var26._M_t.
                                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                _M_head_impl + 0x28))->
                        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        )._M_t.
                        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
              '\0') {
            pBVar23 = (BinderException *)__cxa_allocate_exception(0x10);
            local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2c8,
                       "Column \"%s\" was selected but was not found in the FROM clause","");
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            _Var4._M_head_impl =
                 (((pointer)
                  ((long)_Var26._M_t.
                         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 8)
                  )->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_118,_Var4._M_head_impl,
                       (long)&(((((pointer)
                                 ((long)_Var26._M_t.
                                        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                        _M_head_impl + 0x10))->
                                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                )._M_t.
                                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                               _M_head_impl)->super_BaseExpression)._vptr_BaseExpression +
                       (long)_Var4._M_head_impl);
            BinderException::BinderException<std::__cxx11::string>(pBVar23,&local_2c8,&local_118);
            __cxa_throw(pBVar23,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        psVar13 = (string *)local_238;
        local_2e8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
        local_2e8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
        local_2e8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_238._16_8_;
        local_2c8._M_dataplus._M_p = (pointer)puVar7;
        local_238._0_8_ = (BaseExpression *)0x0;
        local_238._8_8_ = (ExpressionBinder *)0x0;
        local_238._16_8_ = 0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)&local_2c8);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_288);
      }
      else {
        if (local_220.type_.id_ != '\x19') {
LAB_00da00cf:
          pBVar23 = (BinderException *)__cxa_allocate_exception(0x10);
          pSVar20 = local_2f8;
          local_288._0_8_ = local_278;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,
                     "COLUMNS expects either a VARCHAR argument (regex) or a LIST of VARCHAR (list of columns)"
                     ,"");
          BinderException::BinderException<>
                    (pBVar23,&pSVar20->super_ParsedExpression,(string *)local_288);
          __cxa_throw(pBVar23,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (local_220.is_null == true) {
          pBVar23 = (BinderException *)__cxa_allocate_exception(0x10);
          local_288._0_8_ = local_278;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"COLUMNS does not support NULL as regex argument","");
          BinderException::BinderException(pBVar23,(string *)local_288);
          __cxa_throw(pBVar23,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        psVar13 = StringValue::Get_abi_cxx11_((Value *)(local_238 + 0x18));
        this_00 = (RE2 *)operator_new(0x98);
        duckdb_re2::RE2::RE2(this_00,psVar13);
        _Var6._M_head_impl = local_2f0._M_head_impl;
        bVar27 = local_2f0._M_head_impl != (RE2 *)0x0;
        local_2f0._M_head_impl = this_00;
        if (bVar27) {
          duckdb_re2::RE2::~RE2(_Var6._M_head_impl);
          operator_delete(_Var6._M_head_impl);
        }
        pRVar14 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::
                  operator->((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>
                              *)&local_2f0);
        puVar7 = local_2e8.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_248 = psVar13;
        if (pRVar14->error_->_M_string_length != 0) {
          local_138[0] = local_128;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_138,"Failed to compile regex \"%s\": %s","");
          pcVar5 = (local_248->_M_dataplus)._M_p;
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,pcVar5,pcVar5 + local_248->_M_string_length);
          pRVar14 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::
                    operator->((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>
                                *)&local_2f0);
          pcVar5 = (pRVar14->error_->_M_dataplus)._M_p;
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,pcVar5,pcVar5 + pRVar14->error_->_M_string_length);
          StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_288,(StringUtil *)local_138,&local_158,&local_178,params_1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          if (local_138[0] != local_128) {
            operator_delete(local_138[0]);
          }
          pBVar23 = (BinderException *)__cxa_allocate_exception(0x10);
          BinderException::BinderException<>
                    (pBVar23,&local_2f8->super_ParsedExpression,(string *)local_288);
          __cxa_throw(pBVar23,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_2c8._M_dataplus._M_p = (pointer)0x0;
        local_2c8._M_string_length = 0;
        local_2c8.field_2._M_allocated_capacity = 0;
        if (local_2e8.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_2e8.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e8.
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          do {
            pPVar15 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)&paVar25->_M_allocated_capacity);
            local_238._0_8_ = GetResolvedColumnExpression(pPVar15);
            if ((ParsedExpression *)local_238._0_8_ != (ParsedExpression *)0x0) {
              optional_ptr<duckdb::ParsedExpression,_true>::CheckValid
                        ((optional_ptr<duckdb::ParsedExpression,_true> *)local_238);
              pCVar16 = BaseExpression::Cast<duckdb::ColumnRefExpression>
                                  ((BaseExpression *)local_238._0_8_);
              psVar13 = ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar16);
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(psVar13->_M_dataplus)._M_p;
              paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)psVar13->_M_string_length;
              re = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::
                   operator*((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>
                              *)&local_2f0);
              local_288._0_8_ = paVar1;
              local_288._8_8_ = paVar2;
              bVar27 = duckdb_re2::RE2::PartialMatchN((StringPiece *)local_288,re,(Arg **)0x0,0);
              if (bVar27) {
                ::std::
                vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                            *)&local_2c8,
                           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)&paVar25->_M_allocated_capacity);
              }
            }
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar25 + 8);
          } while (paVar25 !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)puVar7);
        }
        local_278._0_8_ =
             local_2e8.
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar8 = local_2e8.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar7 = local_2e8.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_2c8._M_dataplus._M_p == (pointer)local_2c8._M_string_length) {
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_string_length;
          local_198[0] = local_188;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,"No matching columns found that match regex \"%s\"","");
          pcVar5 = (local_248->_M_dataplus)._M_p;
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,pcVar5,pcVar5 + local_248->_M_string_length);
          StringUtil::Format<std::__cxx11::string>
                    ((string *)local_288,(StringUtil *)local_198,&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar25);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p);
          }
          if (local_198[0] != local_188) {
            operator_delete(local_198[0]);
          }
          pBVar23 = (BinderException *)__cxa_allocate_exception(0x10);
          BinderException::BinderException<>
                    (pBVar23,&local_2f8->super_ParsedExpression,(string *)local_288);
          __cxa_throw(pBVar23,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_2e8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2c8._M_dataplus._M_p;
        local_2e8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2c8._M_string_length;
        psVar13 = &local_2c8;
        local_2e8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_2c8.field_2._M_allocated_capacity;
        local_288._0_8_ = puVar7;
        local_288._8_8_ = puVar8;
        local_2c8._M_dataplus._M_p = (pointer)0x0;
        local_2c8._M_string_length = 0;
        local_2c8.field_2._M_allocated_capacity = 0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)local_288);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)psVar13);
      Value::~Value((Value *)(local_238 + 0x18));
      this = local_1e0;
      if ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)local_2d0
          != (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)0x0) {
        (**(code **)(*(_func_int **)local_2d0 + 8))();
      }
      if (local_290 != (Binder *)0x0) {
        (*(code *)(((local_290->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal
                    .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      local_b8.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)&PTR__TableFunctionBinder_02479d20;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.table_function_name._M_dataplus._M_p != &local_b8.table_function_name.field_2)
      {
        operator_delete(local_b8.table_function_name._M_dataplus._M_p);
      }
      ExpressionBinder::~ExpressionBinder(&local_b8.super_ExpressionBinder);
    }
    (*(local_2f8->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[0xc])
              (local_238 + 0x18);
    this_02 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)(local_238 + 0x18))->super_BaseExpression;
    pSVar20 = BaseExpression::Cast<duckdb::StarExpression>(this_02);
    if (SVar9 == UNPACKED) {
      pPVar15 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)local_298);
      bVar27 = StarExpression::IsColumnsUnpacked(pPVar15);
      if (bVar27) {
        pBVar23 = (BinderException *)__cxa_allocate_exception(0x10);
        local_b8.super_ExpressionBinder._vptr_ExpressionBinder =
             (_func_int **)&local_b8.super_ExpressionBinder.target_type.type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"*COLUMNS not allowed at the root level, use COLUMNS instead"
                   ,"");
        BinderException::BinderException(pBVar23,(string *)&local_b8);
        __cxa_throw(pBVar23,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ReplaceUnpackedStarExpression
                (this,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       *)local_298,(expression_list_t *)&local_2e8,pSVar20,
                 (optional_ptr<duckdb_re2::RE2,_true>)local_2f0._M_head_impl);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)local_240,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_298);
    }
    else if (local_2e8.
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_2e8.
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)local_298);
        (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[0xc])
                  ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_288,pPVar11);
        pvVar21 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)&local_2e8,__n);
        ReplaceStarExpression
                  ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_288,pvVar21);
        bVar27 = StarExpression::IsColumns(&pSVar20->super_ParsedExpression);
        if (bVar27) {
          pvVar21 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                  *)&local_2e8,__n);
          pPVar15 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(pvVar21);
          local_2c8._M_dataplus._M_p = (pointer)GetResolvedColumnExpression(pPVar15);
          if ((ParsedExpression *)local_2c8._M_dataplus._M_p != (ParsedExpression *)0x0) {
            optional_ptr<duckdb::ParsedExpression,_true>::CheckValid
                      ((optional_ptr<duckdb::ParsedExpression,_true> *)&local_2c8);
            pCVar16 = BaseExpression::Cast<duckdb::ColumnRefExpression>
                                ((BaseExpression *)local_2c8._M_dataplus._M_p);
            pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                    *)local_288);
            if ((pPVar11->super_BaseExpression).alias._M_string_length == 0) {
              pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                      *)local_288);
              ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar16);
              ::std::__cxx11::string::_M_assign((string *)&(pPVar11->super_BaseExpression).alias);
            }
            else {
              pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                      *)local_288);
              pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                      *)local_288);
              psVar13 = ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar16);
              ReplaceColumnsAlias((string *)&local_b8,&(pPVar22->super_BaseExpression).alias,psVar13
                                  ,(optional_ptr<duckdb_re2::RE2,_true>)local_2f0._M_head_impl);
              ::std::__cxx11::string::operator=
                        ((string *)&(pPVar11->super_BaseExpression).alias,(string *)&local_b8);
              if ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                  local_b8.super_ExpressionBinder._vptr_ExpressionBinder !=
                  &local_b8.super_ExpressionBinder.target_type.type_info_) {
                operator_delete(local_b8.super_ExpressionBinder._vptr_ExpressionBinder);
              }
            }
          }
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_240,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_288._0_8_ + 8))();
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)local_2e8.
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2e8.
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if ((long *)local_220.type_._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_220.type_._0_8_ + 8))();
    }
    _Var6._M_head_impl = local_2f0._M_head_impl;
    if (local_2f0._M_head_impl != (RE2 *)0x0) {
      duckdb_re2::RE2::~RE2(local_2f0._M_head_impl);
      operator_delete(_Var6._M_head_impl);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_2e8);
  }
  return;
}

Assistant:

void Binder::ExpandStarExpression(unique_ptr<ParsedExpression> expr,
                                  vector<unique_ptr<ParsedExpression>> &new_select_list) {
	TryTransformStarLike(expr);

	StarExpression *star = nullptr;

	//! Check the current 'expr' to find out if it contains a star-expression
	//! that needs to be expanded
	auto star_type = FindStarExpression(expr, &star, true, false);
	if (star_type == StarExpressionType::NONE) {
		// no star expression: add it as-is
		D_ASSERT(!star);
		new_select_list.push_back(std::move(expr));
		return;
	}
	D_ASSERT(star);
	vector<unique_ptr<ParsedExpression>> star_list;
	//! Expand the star that we found into a new list of expressions
	bind_context.GenerateAllColumnExpressions(*star, star_list);

	unique_ptr<duckdb_re2::RE2> regex;
	if (star->expr) {
		// COLUMNS with an expression
		// two options:
		// VARCHAR parameter <- this is a regular expression
		// LIST of VARCHAR parameters <- this is a set of columns
		TableFunctionBinder binder(*this, context);
		auto child = star->expr->Copy();
		auto result = binder.Bind(child);
		if (!result->IsFoldable()) {
			// cannot resolve parameters here
			if (star->expr->HasParameter()) {
				throw ParameterNotResolvedException();
			} else {
				throw BinderException("Unsupported expression in COLUMNS");
			}
		}
		auto val = ExpressionExecutor::EvaluateScalar(context, *result);
		if (val.type().id() == LogicalTypeId::VARCHAR) {
			// regex
			if (val.IsNull()) {
				throw BinderException("COLUMNS does not support NULL as regex argument");
			}
			auto &regex_str = StringValue::Get(val);
			regex = make_uniq<duckdb_re2::RE2>(regex_str);
			if (!regex->error().empty()) {
				auto err = StringUtil::Format("Failed to compile regex \"%s\": %s", regex_str, regex->error());
				throw BinderException(*star, err);
			}
			vector<unique_ptr<ParsedExpression>> new_list;
			for (auto &expanded_expr : star_list) {
				auto child_expr = GetResolvedColumnExpression(*expanded_expr);
				if (!child_expr) {
					continue;
				}
				auto &colref = child_expr->Cast<ColumnRefExpression>();
				if (!RE2::PartialMatch(colref.GetColumnName(), *regex)) {
					continue;
				}
				new_list.push_back(std::move(expanded_expr));
			}
			if (new_list.empty()) {
				auto err = StringUtil::Format("No matching columns found that match regex \"%s\"", regex_str);
				throw BinderException(*star, err);
			}
			star_list = std::move(new_list);
		} else if (val.type().id() == LogicalTypeId::LIST &&
		           ListType::GetChildType(val.type()).id() == LogicalTypeId::VARCHAR) {
			// list of varchar columns
			if (val.IsNull() || ListValue::GetChildren(val).empty()) {
				auto err =
				    StringUtil::Format("Star expression \"%s\" resulted in an empty set of columns", star->ToString());
				throw BinderException(*star, err);
			}
			auto &children = ListValue::GetChildren(val);
			vector<unique_ptr<ParsedExpression>> new_list;
			// scan the list for all selected columns and construct a lookup table
			case_insensitive_map_t<bool> selected_set;
			for (auto &child : children) {
				if (child.IsNull()) {
					throw BinderException(*star, "Columns expression does not support NULL input parameters");
				}
				selected_set.insert(make_pair(StringValue::Get(child), false));
			}
			// now check the list of all possible expressions and select which ones make it in
			for (auto &expr : star_list) {
				auto str = GetColumnsStringValue(*expr);
				auto entry = selected_set.find(str);
				if (entry != selected_set.end()) {
					new_list.push_back(std::move(expr));
					entry->second = true;
				}
			}
			// check if all expressions found a match
			for (auto &entry : selected_set) {
				if (!entry.second) {
					throw BinderException("Column \"%s\" was selected but was not found in the FROM clause",
					                      entry.first);
				}
			}
			star_list = std::move(new_list);
		} else {
			throw BinderException(
			    *star, "COLUMNS expects either a VARCHAR argument (regex) or a LIST of VARCHAR (list of columns)");
		}
	}
	//! We make a copy because we will be replacing the original star
	//! If we have identical stars that also need to be replaced
	//! This causes a heap-use-after-free or other corruption if we don't make a copy to reference instead.
	auto copied_star_p = star->Copy();
	auto &copied_star = copied_star_p->Cast<StarExpression>();

	// now perform the replacement
	if (star_type == StarExpressionType::UNPACKED) {
		if (StarExpression::IsColumnsUnpacked(*expr)) {
			throw BinderException("*COLUMNS not allowed at the root level, use COLUMNS instead");
		}
		ReplaceUnpackedStarExpression(expr, star_list, copied_star, regex.get());
		new_select_list.push_back(std::move(expr));
		return;
	}
	for (idx_t i = 0; i < star_list.size(); i++) {
		auto new_expr = expr->Copy();
		ReplaceStarExpression(new_expr, star_list[i]);
		if (StarExpression::IsColumns(copied_star)) {
			auto expr = GetResolvedColumnExpression(*star_list[i]);
			if (expr) {
				auto &colref = expr->Cast<ColumnRefExpression>();
				if (new_expr->GetAlias().empty()) {
					new_expr->SetAlias(colref.GetColumnName());
				} else {
					new_expr->SetAlias(ReplaceColumnsAlias(new_expr->GetAlias(), colref.GetColumnName(), regex.get()));
				}
			}
		}
		new_select_list.push_back(std::move(new_expr));
	}
}